

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testMultiPartThreading.cpp
# Opt level: O1

void __thiscall anon_unknown.dwarf_22493e::RandomReadingTask::execute(RandomReadingTask *this)

{
  undefined4 uVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  pthread_mutex_t *__mutex;
  long lVar8;
  TiledInputPart part;
  Box2i b1;
  Box2i b2;
  Array2D<Imath_3_2::half> hData;
  Array2D<float> fData;
  Array2D<unsigned_int> uData;
  FrameBuffer frameBuffer;
  undefined1 local_100 [24];
  FrameBuffer local_e8;
  Array2D<Imath_3_2::half> local_b8;
  Array2D<float> local_98;
  Array2D<unsigned_int> local_78;
  _Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
  local_60;
  
  iVar3 = random_int((int)((ulong)(DAT_001efc30 - (anonymous_namespace)::headers) >> 3) *
                     -0x49249249);
  lVar8 = (long)iVar3;
  local_100._16_4_ = *(int *)((anonymous_namespace)::pixelTypes + lVar8 * 4);
  local_78._data = (uint *)0x0;
  local_78._sizeX = 0;
  local_78._sizeY = 0;
  local_98._data = (float *)0x0;
  local_98._sizeX = 0;
  local_98._sizeY = 0;
  local_b8._data = (half *)0x0;
  local_b8._sizeX = 0;
  local_b8._sizeY = 0;
  if (*(int *)((anonymous_namespace)::partTypes + lVar8 * 4) == 0) {
    iVar6 = random_int(0x107);
    iVar5 = random_int(0x107);
    iVar4 = iVar5;
    if (iVar5 < iVar6) {
      iVar4 = iVar6;
    }
    if (iVar6 < iVar5) {
      iVar5 = iVar6;
    }
    Imf_3_2::InputPart::InputPart((InputPart *)&local_e8,this->file,iVar3);
    __mutex = (pthread_mutex_t *)((anonymous_namespace)::mutexes + lVar8 * 0x28);
    iVar3 = pthread_mutex_lock(__mutex);
    if (iVar3 == 0) {
      local_60._M_impl.super__Rb_tree_header._M_header._M_left =
           &local_60._M_impl.super__Rb_tree_header._M_header;
      local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_60._M_impl.super__Rb_tree_header._M_header._M_right =
           local_60._M_impl.super__Rb_tree_header._M_header._M_left;
      setInputFrameBuffer((FrameBuffer *)&local_60,local_100._16_4_,&local_78,&local_98,&local_b8,
                          0xc5,0x107);
      Imf_3_2::InputPart::setFrameBuffer(&local_e8);
      Imf_3_2::InputPart::readPixels((int)&local_e8,iVar5);
      if (local_100._16_4_ == 0) {
        bVar2 = checkPixels<unsigned_int>(&local_78,0,0xc4,iVar5,iVar4,0xc5);
        if (!bVar2) {
          __assert_fail("checkPixels<unsigned int> ( uData, 0, width - 1, l1, l2, width)",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testMultiPartThreading.cpp"
                        ,0x12f,"virtual void (anonymous namespace)::RandomReadingTask::execute()");
        }
      }
      else if (local_100._16_4_ == 1) {
        bVar2 = checkPixels<float>(&local_98,0,0xc4,iVar5,iVar4,0xc5);
        if (!bVar2) {
          __assert_fail("checkPixels<float> ( fData, 0, width - 1, l1, l2, width)",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testMultiPartThreading.cpp"
                        ,0x133,"virtual void (anonymous namespace)::RandomReadingTask::execute()");
        }
      }
      else if ((local_100._16_4_ == 2) &&
              (bVar2 = checkPixels<Imath_3_2::half>(&local_b8,0,0xc4,iVar5,iVar4,0xc5), !bVar2)) {
        __assert_fail("checkPixels<half> (hData, 0, width - 1, l1, l2, width)",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testMultiPartThreading.cpp"
                      ,0x137,"virtual void (anonymous namespace)::RandomReadingTask::execute()");
      }
      std::
      _Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
      ::~_Rb_tree(&local_60);
      goto LAB_0018946a;
    }
  }
  else {
    Imf_3_2::TiledInputPart::TiledInputPart((TiledInputPart *)local_100,this->file,iVar3);
    local_e8._map._M_t._M_impl.super__Rb_tree_header._M_node_count =
         (size_t)((anonymous_namespace)::mutexes + lVar8 * 0x28);
    iVar3 = pthread_mutex_lock((pthread_mutex_t *)
                               local_e8._map._M_t._M_impl.super__Rb_tree_header._M_node_count);
    if (iVar3 == 0) {
      iVar3 = Imf_3_2::TiledInputPart::numXLevels();
      iVar4 = Imf_3_2::TiledInputPart::numYLevels();
      iVar3 = random_int(iVar3);
      random_int(iVar4);
      local_100._12_4_ = Imf_3_2::TiledInputPart::levelWidth((int)local_100);
      iVar4 = Imf_3_2::TiledInputPart::levelHeight((int)local_100);
      iVar5 = Imf_3_2::TiledInputPart::numXTiles((int)local_100);
      local_100._20_4_ = iVar3;
      local_e8._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent._4_4_ = iVar4;
      iVar3 = Imf_3_2::TiledInputPart::numYTiles((int)local_100);
      iVar6 = random_int(iVar5);
      iVar4 = random_int(iVar5);
      iVar7 = random_int(iVar3);
      iVar5 = random_int(iVar3);
      uVar1 = local_100._16_4_;
      iVar3 = iVar4;
      if (iVar6 < iVar4) {
        iVar3 = iVar6;
      }
      if (iVar4 < iVar6) {
        iVar4 = iVar6;
      }
      iVar6 = iVar5;
      if (iVar7 < iVar5) {
        iVar6 = iVar7;
      }
      if (iVar5 < iVar7) {
        iVar5 = iVar7;
      }
      local_60._M_impl.super__Rb_tree_header._M_header._M_left =
           &local_60._M_impl.super__Rb_tree_header._M_header;
      local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_60._M_impl.super__Rb_tree_header._M_header._M_right =
           local_60._M_impl.super__Rb_tree_header._M_header._M_left;
      setInputFrameBuffer((FrameBuffer *)&local_60,local_100._16_4_,&local_78,&local_98,&local_b8,
                          local_100._12_4_,
                          local_e8._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent._4_4_
                         );
      Imf_3_2::TiledInputPart::setFrameBuffer((FrameBuffer *)local_100);
      Imf_3_2::TiledInputPart::readTiles((int)local_100,iVar3,iVar4,iVar6,iVar5,local_100._20_4_);
      Imf_3_2::TiledInputPart::dataWindowForTile((int)&local_e8,(int)local_100,iVar3,iVar6);
      Imf_3_2::TiledInputPart::dataWindowForTile((int)&local_e8 + 0x18,(int)local_100,iVar4,iVar5);
      if (uVar1 == 0) {
        bVar2 = checkPixels<unsigned_int>
                          (&local_78,local_e8._map._M_t._M_impl._0_4_,
                           (int)local_e8._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right,
                           local_e8._map._M_t._M_impl._4_4_,
                           local_e8._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right._4_4_
                           ,local_100._12_4_);
        if (!bVar2) goto LAB_001894c2;
      }
      else if (uVar1 == 1) {
        bVar2 = checkPixels<float>(&local_98,local_e8._map._M_t._M_impl._0_4_,
                                   (int)local_e8._map._M_t._M_impl.super__Rb_tree_header._M_header.
                                        _M_right,local_e8._map._M_t._M_impl._4_4_,
                                   local_e8._map._M_t._M_impl.super__Rb_tree_header._M_header.
                                   _M_right._4_4_,local_100._12_4_);
        if (!bVar2) {
          __assert_fail("checkPixels<float> ( fData, b1.min.x, b2.max.x, b1.min.y, b2.max.y, w)",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testMultiPartThreading.cpp"
                        ,0x16c,"virtual void (anonymous namespace)::RandomReadingTask::execute()");
        }
      }
      else if ((uVar1 == 2) &&
              (bVar2 = checkPixels<Imath_3_2::half>
                                 (&local_b8,local_e8._map._M_t._M_impl._0_4_,
                                  (int)local_e8._map._M_t._M_impl.super__Rb_tree_header._M_header.
                                       _M_right,local_e8._map._M_t._M_impl._4_4_,
                                  local_e8._map._M_t._M_impl.super__Rb_tree_header._M_header.
                                  _M_right._4_4_,local_100._12_4_), !bVar2)) {
        __assert_fail("checkPixels<half> ( hData, b1.min.x, b2.max.x, b1.min.y, b2.max.y, w)",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testMultiPartThreading.cpp"
                      ,0x170,"virtual void (anonymous namespace)::RandomReadingTask::execute()");
      }
      std::
      _Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
      ::~_Rb_tree(&local_60);
      __mutex = (pthread_mutex_t *)local_e8._map._M_t._M_impl.super__Rb_tree_header._M_node_count;
LAB_0018946a:
      pthread_mutex_unlock(__mutex);
      if (local_b8._data != (half *)0x0) {
        operator_delete__(local_b8._data);
      }
      if (local_98._data != (float *)0x0) {
        operator_delete__(local_98._data);
      }
      if (local_78._data != (uint *)0x0) {
        operator_delete__(local_78._data);
      }
      return;
    }
    iVar3 = std::__throw_system_error(iVar3);
  }
  std::__throw_system_error(iVar3);
LAB_001894c2:
  __assert_fail("checkPixels<unsigned int> ( uData, b1.min.x, b2.max.x, b1.min.y, b2.max.y, w)",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testMultiPartThreading.cpp"
                ,0x168,"virtual void (anonymous namespace)::RandomReadingTask::execute()");
}

Assistant:

void execute ()
    {
        int partNumber = random_int (headers.size ());
        int partType   = partTypes[partNumber];
        int pixelType  = pixelTypes[partNumber];
        int levelMode  = levelModes[partNumber];

        Array2D<unsigned int> uData;
        Array2D<float>        fData;
        Array2D<half>         hData;
        if (partType == 0)
        {
            int l1, l2;
            l1 = random_int (height);
            l2 = random_int (height);
            if (l1 > l2) swap (l1, l2);

            InputPart part (*file, partNumber);
            //
            // We add lock here to assure that two threads that accessing
            // the same part won't mess things up.
            //
            std::lock_guard<std::mutex> lock (mutexes[partNumber]);

            FrameBuffer frameBuffer;
            setInputFrameBuffer (
                frameBuffer, pixelType, uData, fData, hData, width, height);

            part.setFrameBuffer (frameBuffer);
            part.readPixels (l1, l2);

            switch (pixelType)
            {
                case 0:
                    assert (checkPixels<unsigned int> (
                        uData, 0, width - 1, l1, l2, width));
                    break;
                case 1:
                    assert (checkPixels<float> (
                        fData, 0, width - 1, l1, l2, width));
                    break;
                case 2:
                    assert (
                        checkPixels<half> (hData, 0, width - 1, l1, l2, width));
                    break;
            }
        }
        else
        {
            int tx1, tx2, ty1, ty2;
            int lx, ly;

            TiledInputPart part (*file, partNumber);
            //
            // We add lock here to assure that two threads that accessing
            // the same part won't mess things up.
            //
            std::lock_guard<std::mutex> lock (mutexes[partNumber]);

            int numXLevels = part.numXLevels ();
            int numYLevels = part.numYLevels ();

            lx = random_int (numXLevels);
            ly = random_int (numYLevels);
            if (levelMode == 1) ly = lx;

            int w = part.levelWidth (lx);
            int h = part.levelHeight (ly);

            int numXTiles = part.numXTiles (lx);
            int numYTiles = part.numYTiles (ly);
            tx1           = random_int (numXTiles);
            tx2           = random_int (numXTiles);
            ty1           = random_int (numYTiles);
            ty2           = random_int (numYTiles);
            if (tx1 > tx2) swap (tx1, tx2);
            if (ty1 > ty2) swap (ty1, ty2);

            FrameBuffer frameBuffer;
            setInputFrameBuffer (
                frameBuffer, pixelType, uData, fData, hData, w, h);

            part.setFrameBuffer (frameBuffer);
            part.readTiles (tx1, tx2, ty1, ty2, lx, ly);

            Box2i b1 = part.dataWindowForTile (tx1, ty1, lx, ly);
            Box2i b2 = part.dataWindowForTile (tx2, ty2, lx, ly);

            switch (pixelType)
            {
                case 0:
                    assert (checkPixels<unsigned int> (
                        uData, b1.min.x, b2.max.x, b1.min.y, b2.max.y, w));
                    break;
                case 1:
                    assert (checkPixels<float> (
                        fData, b1.min.x, b2.max.x, b1.min.y, b2.max.y, w));
                    break;
                case 2:
                    assert (checkPixels<half> (
                        hData, b1.min.x, b2.max.x, b1.min.y, b2.max.y, w));
                    break;
            }
        }
    }